

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O2

void cie_lab(double *p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  int j;
  long lVar5;
  anon_class_1_0_00000001 *this;
  double dVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 extraout_var [56];
  
  dVar4 = xyz_whitepoint[2];
  dVar6 = xyz_whitepoint[0];
  auVar10 = ZEXT816(0) << 0x40;
  auVar11 = ZEXT816(0) << 0x40;
  auVar8 = ZEXT816(0);
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = p[lVar5];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = rgb_to_xyz[0][lVar5];
    auVar11 = vfmadd231sd_fma(auVar11,auVar9,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = rgb_to_xyz[1][lVar5];
    auVar8 = vfmadd231sd_fma(auVar8,auVar9,auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = rgb_to_xyz[2][lVar5];
    auVar10 = vfmadd231sd_fma(auVar10,auVar9,auVar3);
  }
  this = (anon_class_1_0_00000001 *)p;
  auVar7._0_8_ = cie_lab::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)p,auVar8._0_8_ / xyz_whitepoint[1]);
  auVar7._8_56_ = extraout_var;
  auVar8 = vfmadd213sd_fma(ZEXT816(0x405d000000000000),auVar7._0_16_,ZEXT816(0xc030000000000000));
  *p = auVar8._0_8_;
  dVar6 = cie_lab::anon_class_1_0_00000001::operator()(this,auVar11._0_8_ / dVar6);
  p[1] = (dVar6 - auVar7._0_8_) * 500.0;
  dVar6 = cie_lab::anon_class_1_0_00000001::operator()(this,auVar10._0_8_ / dVar4);
  p[2] = (auVar7._0_8_ - dVar6) * 200.0;
  return;
}

Assistant:

void cie_lab(double *p) {
    double X = 0.0, Y = 0.0, Z = 0.0, Xw = xyz_whitepoint[0], Yw = xyz_whitepoint[1],
           Zw = xyz_whitepoint[2];

    for (int j = 0; j < 3; ++j) {
        X += p[j] * rgb_to_xyz[0][j];
        Y += p[j] * rgb_to_xyz[1][j];
        Z += p[j] * rgb_to_xyz[2][j];
    }

    auto f = [](double t) -> double {
        double delta = 6.0 / 29.0;
        if (t > delta * delta * delta)
            return cbrt(t);
        else
            return t / (delta * delta * 3.0) + (4.0 / 29.0);
    };

    p[0] = 116.0 * f(Y / Yw) - 16.0;
    p[1] = 500.0 * (f(X / Xw) - f(Y / Yw));
    p[2] = 200.0 * (f(Y / Yw) - f(Z / Zw));
}